

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<PushPopTest>::AddTestPattern
          (ParameterizedTestCaseInfo<PushPopTest> *this,char *test_case_name,char *test_base_name,
          TestMetaFactoryBase<unsigned_long> *meta_factory)

{
  TestMetaFactoryBase<unsigned_long> *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  TestInfo *in_stack_00000010;
  TestInfo *ptr;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *this_00;
  
  this_00 = (linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
            (in_RDI + 10);
  operator_new(0x48);
  TestInfo::TestInfo(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  ptr = (TestInfo *)&stack0xffffffffffffffd0;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::linked_ptr
            (this_00,ptr);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
  ::push_back((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
               *)this_00,(value_type *)ptr);
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::~linked_ptr
            ((linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
             0x16024e);
  return;
}

Assistant:

void AddTestPattern(const char* test_case_name,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory) {
    tests_.push_back(linked_ptr<TestInfo>(new TestInfo(test_case_name,
                                                       test_base_name,
                                                       meta_factory)));
  }